

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O0

Chuck * FindSmallestFit(Chuck *start,Size size)

{
  uint8_t uVar1;
  Size SVar2;
  Chuck *local_28;
  Chuck *current;
  Size size_local;
  Chuck *start_local;
  
  local_28 = start;
  while( true ) {
    if (local_28 == (Chuck *)0x0) {
      return (Chuck *)0x0;
    }
    uVar1 = GetUsed(local_28);
    if (uVar1 != '\0') break;
    SVar2 = GetSize(local_28);
    if (size <= SVar2) {
      return local_28;
    }
    local_28 = local_28->next;
  }
  __assert_fail("!GetUsed(current)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,0x71,"Chuck *FindSmallestFit(Chuck *, Size)");
}

Assistant:

static Chuck *FindSmallestFit(Chuck *start, Size size) {
    for (Chuck *current = start; current; current = current->next) {
        assert(!GetUsed(current));
        if (GetSize(current) >= size) {
            return current;
        }
    }
    return NULL;
}